

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O0

IWrittenFont * __thiscall
FreeTypeFaceWrapper::CreateWrittenFontObject
          (FreeTypeFaceWrapper *this,ObjectsContext *inObjectsContext,bool inFontIsToBeEmbedded)

{
  int iVar1;
  FT_Error FVar2;
  WrittenFontCFF *this_00;
  WrittenFontTrueType *this_01;
  Trace *this_02;
  FT_Bool local_39;
  char *pcStack_38;
  FT_Bool isCID;
  char *fontFormat;
  IWrittenFont *result;
  ObjectsContext *pOStack_20;
  bool inFontIsToBeEmbedded_local;
  ObjectsContext *inObjectsContext_local;
  FreeTypeFaceWrapper *this_local;
  
  if (this->mFace == (FT_Face)0x0) {
    this_local = (FreeTypeFaceWrapper *)0x0;
  }
  else {
    result._7_1_ = inFontIsToBeEmbedded;
    pOStack_20 = inObjectsContext;
    inObjectsContext_local = (ObjectsContext *)this;
    pcStack_38 = FT_Get_X11_Font_Format(this->mFace);
    iVar1 = strcmp(pcStack_38,scType1);
    if ((iVar1 == 0) || (iVar1 = strcmp(pcStack_38,scCFF), iVar1 == 0)) {
      local_39 = '\0';
      FVar2 = FT_Get_CID_Is_Internally_CID_Keyed(this->mFace,&local_39);
      if (FVar2 != 0) {
        local_39 = '\0';
      }
      this_00 = (WrittenFontCFF *)operator_new(0x560);
      WrittenFontCFF::WrittenFontCFF
                (this_00,pOStack_20,this,local_39 != '\0',(bool)(result._7_1_ & 1));
      fontFormat = (char *)this_00;
    }
    else {
      iVar1 = strcmp(pcStack_38,scTrueType);
      if (iVar1 == 0) {
        this_01 = (WrittenFontTrueType *)operator_new(0x40);
        WrittenFontTrueType::WrittenFontTrueType(this_01,pOStack_20,this);
        fontFormat = (char *)this_01;
      }
      else {
        fontFormat = (char *)0x0;
        this_02 = Trace::DefaultTrace();
        Trace::TraceToLog(this_02,
                          "Failure in FreeTypeFaceWrapper::CreateWrittenFontObject, could not find font writer implementation for %s"
                          ,pcStack_38);
      }
    }
    this_local = (FreeTypeFaceWrapper *)fontFormat;
  }
  return (IWrittenFont *)this_local;
}

Assistant:

IWrittenFont* FreeTypeFaceWrapper::CreateWrittenFontObject(ObjectsContext* inObjectsContext, bool inFontIsToBeEmbedded)
{
	if(mFace)
	{
		IWrittenFont* result;
		const char* fontFormat = FT_Get_X11_Font_Format(mFace);

		if(strcmp(fontFormat,scType1) == 0 || strcmp(fontFormat,scCFF) == 0)
		{
			FT_Bool isCID = false;
			
			// CFF written fonts needs to know if the font is originally CID in order to disallow ANSI form in this case
			if(FT_Get_CID_Is_Internally_CID_Keyed(mFace,&isCID) != 0)
				isCID = false;	

			result = new WrittenFontCFF(inObjectsContext, this,isCID != 0, inFontIsToBeEmbedded); // CFF fonts should know if font is to be embedded, as the embedding code involves re-encoding of glyphs
		}
		else if(strcmp(fontFormat,scTrueType) == 0)
		{
			result = new WrittenFontTrueType(inObjectsContext, this);
		}
		else
		{
			result = NULL;
			TRACE_LOG1("Failure in FreeTypeFaceWrapper::CreateWrittenFontObject, could not find font writer implementation for %s",
				fontFormat);
		}
		return result;
	}
	else
		return NULL;	
}